

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::post_torrent_updates(session_impl *this,status_flags_t flags)

{
  pointer pptVar1;
  torrent **t;
  pointer pptVar2;
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> status;
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> local_48;
  
  local_48.
  super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::reserve
            (&local_48,
             (long)*(pointer *)
                    ((long)&(this->m_torrent_lists).
                            super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                            ._M_elems[0].
                            super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                            .
                            super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                            ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->m_torrent_lists).
                   super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                   ._M_elems[0].
                   super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                   .
                   super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  pptVar1 = *(pointer *)
             ((long)&(this->m_torrent_lists).
                     super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                     ._M_elems[0].
                     super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                     .
                     super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                     ._M_impl.super__Vector_impl_data + 8);
  for (pptVar2 = (this->m_torrent_lists).
                 super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                 ._M_elems[0].
                 super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                 .
                 super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; pptVar2 != pptVar1;
      pptVar2 = pptVar2 + 1) {
    ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::
    emplace_back<>(&local_48);
    torrent::status(*pptVar2,local_48.
                             super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1,flags);
    *(undefined4 *)&((*pptVar2)->m_links).super_array<libtorrent::aux::link,_8UL> = 0xffffffff;
  }
  pptVar2 = (this->m_torrent_lists).
            super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
            ._M_elems[0].
            super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
            super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(this->m_torrent_lists).
               super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
               ._M_elems[0].
               super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
               .
               super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
               ._M_impl.super__Vector_impl_data + 8) != pptVar2) {
    *(pointer *)
     ((long)&(this->m_torrent_lists).
             super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
             ._M_elems[0].
             super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
             super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
             ._M_impl.super__Vector_impl_data + 8) = pptVar2;
  }
  alert_manager::
  emplace_alert<libtorrent::state_update_alert,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>>
            (&this->m_alerts,&local_48);
  ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::~vector
            (&local_48);
  return;
}

Assistant:

void session_impl::post_torrent_updates(status_flags_t const flags)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(is_single_thread());

		std::vector<torrent*>& state_updates
			= m_torrent_lists[aux::session_impl::torrent_state_updates];

#if TORRENT_USE_ASSERTS
		m_posting_torrent_updates = true;
#endif

		std::vector<torrent_status> status;
		status.reserve(state_updates.size());

		// TODO: it might be a nice feature here to limit the number of torrents
		// to send in a single update. By just posting the first n torrents, they
		// would nicely be round-robined because the torrent lists are always
		// pushed back. Perhaps the status_update_alert could even have a fixed
		// array of n entries rather than a vector, to further improve memory
		// locality.
		for (auto& t : state_updates)
		{
			TORRENT_ASSERT(t->m_links[aux::session_impl::torrent_state_updates].in_list());
			status.emplace_back();
			// querying accurate download counters may require
			// the torrent to be loaded. Loading a torrent, and evicting another
			// one will lead to calling state_updated(), which screws with
			// this list while we're working on it, and break things
			t->status(&status.back(), flags);
			t->clear_in_state_update();
		}
		state_updates.clear();

#if TORRENT_USE_ASSERTS
		m_posting_torrent_updates = false;
#endif

		m_alerts.emplace_alert<state_update_alert>(std::move(status));
	}